

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O2

string * __thiscall Form::toStringSimple_abi_cxx11_(string *__return_storage_ptr__,Form *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  buildStringSimple(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Form::toStringSimple() {
  std::string result;
  buildStringSimple(result);
  return result;
}